

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::parse_weekday(Datetime *this,Pig *pig,int *value)

{
  bool bVar1;
  size_type previous;
  int weekday;
  int local_1c;
  
  previous = Pig::cursor(pig);
  bVar1 = Pig::getDigit(pig,&local_1c);
  if (((bVar1) && (weekstart <= local_1c)) && (local_1c <= (int)(weekstart == 1 | 6))) {
    *value = local_1c;
    return true;
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_weekday (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int weekday;
  if (pig.getDigit (weekday) &&
      weekday >= Datetime::weekstart &&
      weekday <= (Datetime::weekstart == 1 ? 7 : 6))
  {
    value = weekday;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}